

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

int pcre2_jit_compile_16(pcre2_code_16 *code,uint32_t options)

{
  long *plVar1;
  int iVar2;
  
  if (code == (pcre2_code_16 *)0x0) {
    return -0x33;
  }
  if (7 < options) {
    return -0x2d;
  }
  if ((code->flags & 0x80000) != 0) {
    return 0;
  }
  plVar1 = (long *)code->executable_jit;
  if ((((options & 1) == 0) ||
      (((plVar1 != (long *)0x0 && (*plVar1 != 0)) || (iVar2 = jit_compile(code,1), iVar2 == 0)))) &&
     (((options & 2) == 0 ||
      (((plVar1 != (long *)0x0 && (plVar1[1] != 0)) || (iVar2 = jit_compile(code,2), iVar2 == 0)))))
     ) {
    if (options < 4) {
      return 0;
    }
    if ((plVar1 != (long *)0x0) && (plVar1[2] != 0)) {
      return 0;
    }
    iVar2 = jit_compile(code,4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_jit_compile(pcre2_code *code, uint32_t options)
{
#ifndef SUPPORT_JIT

(void)code;
(void)options;
return PCRE2_ERROR_JIT_BADOPTION;

#else  /* SUPPORT_JIT */

pcre2_real_code *re = (pcre2_real_code *)code;
executable_functions *functions;
int result;

if (code == NULL)
  return PCRE2_ERROR_NULL;

if ((options & ~PUBLIC_JIT_COMPILE_OPTIONS) != 0)
  return PCRE2_ERROR_JIT_BADOPTION;

if ((re->flags & PCRE2_NOJIT) != 0) return 0;

functions = (executable_functions *)re->executable_jit;

if ((options & PCRE2_JIT_COMPLETE) != 0 && (functions == NULL
    || functions->executable_funcs[0] == NULL)) {
  result = jit_compile(code, PCRE2_JIT_COMPLETE);
  if (result != 0)
    return result;
  }

if ((options & PCRE2_JIT_PARTIAL_SOFT) != 0 && (functions == NULL
    || functions->executable_funcs[1] == NULL)) {
  result = jit_compile(code, PCRE2_JIT_PARTIAL_SOFT);
  if (result != 0)
    return result;
  }

if ((options & PCRE2_JIT_PARTIAL_HARD) != 0 && (functions == NULL
    || functions->executable_funcs[2] == NULL)) {
  result = jit_compile(code, PCRE2_JIT_PARTIAL_HARD);
  if (result != 0)
    return result;
  }

return 0;

#endif  /* SUPPORT_JIT */
}